

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main_sqrtAddcbrt(void)

{
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  int iVar1;
  ostream *poVar2;
  reference pvVar3;
  double dVar4;
  double costRate;
  double local_138;
  iterator local_130;
  size_type local_128;
  vector<double,_std::allocator<double>_> local_120;
  allocator<double> local_101;
  double local_100;
  double local_f8;
  iterator local_f0;
  size_type local_e8;
  vector<double,_std::allocator<double>_> local_e0;
  double local_c8;
  double b;
  double a;
  double dStack_b0;
  int i;
  double cost;
  double lastCost;
  vector<double,_std::allocator<double>_> output;
  value_type local_70;
  undefined1 local_68 [8];
  vector<double,_std::allocator<double>_> data;
  FC_BPNN bp;
  
  FC_BPNN::FC_BPNN((FC_BPNN *)
                   &data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,2,6,7,1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_68);
  local_70 = 0.251;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_68,&local_70);
  output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3f9c0ebedfa43fe6;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_68,
             (value_type *)
             &output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&lastCost);
  cost = 0.0;
  dStack_b0 = 0.0;
  for (a._4_4_ = 1; a._4_4_ < 0x3e9; a._4_4_ = a._4_4_ + 1) {
    iVar1 = rand();
    b = (double)(iVar1 % 1000) / 1000.0;
    iVar1 = rand();
    local_f8 = (double)(iVar1 % 1000) / 1000.0;
    local_100 = b;
    local_f0 = &local_100;
    local_e8 = 2;
    local_c8 = local_f8;
    std::allocator<double>::allocator(&local_101);
    __l_00._M_len = local_e8;
    __l_00._M_array = local_f0;
    std::vector<double,_std::allocator<double>_>::vector(&local_e0,__l_00,&local_101);
    local_138 = square_root_add_cube_root(b,local_c8);
    local_130 = &local_138;
    local_128 = 1;
    std::allocator<double>::allocator((allocator<double> *)((long)&costRate + 7));
    __l._M_len = local_128;
    __l._M_array = local_130;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_120,__l,(allocator<double> *)((long)&costRate + 7));
    dVar4 = FC_BPNN::train_once((FC_BPNN *)
                                &data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,&local_e0,&local_120);
    dStack_b0 = dVar4 + dStack_b0;
    std::vector<double,_std::allocator<double>_>::~vector(&local_120);
    std::allocator<double>::~allocator((allocator<double> *)((long)&costRate + 7));
    std::vector<double,_std::allocator<double>_>::~vector(&local_e0);
    std::allocator<double>::~allocator(&local_101);
    if (a._4_4_ % 100 == 0) {
      dStack_b0 = dStack_b0 / 100.0;
      poVar2 = std::operator<<((ostream *)&std::cout,"iter: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,a._4_4_);
      poVar2 = std::operator<<(poVar2," cost: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,dStack_b0);
      poVar2 = std::operator<<(poVar2," step: ");
      dVar4 = FC_BPNN::getLearningStep
                        ((FC_BPNN *)
                         &data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      if ((cost - dStack_b0) / cost <= 0.1) {
        dVar4 = FC_BPNN::getLearningStep
                          ((FC_BPNN *)
                           &data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        FC_BPNN::setLearningStep
                  ((FC_BPNN *)
                   &data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,dVar4 * 0.5);
      }
      cost = dStack_b0;
      dStack_b0 = 0.0;
    }
  }
  FC_BPNN::predict((FC_BPNN *)
                   &data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (vector<double,_std::allocator<double>_> *)local_68,
                   (vector<double,_std::allocator<double>_> *)&lastCost);
  poVar2 = std::operator<<((ostream *)&std::cout,"prediction: ");
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)&lastCost,0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar3);
  poVar2 = std::operator<<(poVar2," gt: ");
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_68,0);
  dVar4 = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_68,1);
  dVar4 = square_root_add_cube_root(dVar4,*pvVar3);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&lastCost);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_68);
  FC_BPNN::~FC_BPNN((FC_BPNN *)
                    &data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  return 1;
}

Assistant:

int main_sqrtAddcbrt() {
	FC_BPNN bp(2, 6, 7, 1);
	std::vector<double> data; data.push_back(0.251); data.push_back(0.0274);
	std::vector<double> output;
	double lastCost = 0.0; double cost = 0.0;
	for (int i = 1; i <= 1000; i++) {
		double a = (double)(rand() % 1000) / 1000;
		double b = (double)(rand() % 1000) / 1000;
		cost += bp.train_once({ a ,b }, { square_root_add_cube_root(a,b) });
		if (i % 100 == 0) {
			cost /= 100;
			std::cout << "iter: " << i << " cost: " << cost << " step: " << bp.getLearningStep() << std::endl;
			double costRate = (lastCost - cost) / lastCost;
			if (costRate <= 0.1) {
				bp.setLearningStep(bp.getLearningStep() / 2);
			}
			lastCost = cost;
			cost = 0.0;
		}
	}
	bp.predict(data, output);
	std::cout << "prediction: " << output[0] << " gt: " << square_root_add_cube_root(data[0], data[1]) << std::endl;
	return 1;
}